

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraohRandomWalk_SRW.h
# Opt level: O0

Estimates * SRW1(Estimates *__return_storage_ptr__,CGraph *cg,Parameters *params)

{
  size_type sVar1;
  size_type sVar2;
  double dVar3;
  reference pvVar4;
  size_type __n;
  long lVar5;
  long *plVar6;
  long *plVar7;
  byte bVar8;
  double dVar9;
  reference rVar10;
  iterator iVar11;
  _Bit_iterator __first;
  _Bit_iterator __first_00;
  _Bit_iterator __last;
  _Bit_iterator __last_00;
  long alStack_53c8 [625];
  vector<bool,_std::allocator<bool>_> *local_4040;
  difference_type local_4038;
  vector<bool,_std::allocator<bool>_> *local_4030;
  difference_type local_4028;
  CGraph *local_4020;
  pointer *local_4018;
  OrderedEdgeCollection *local_4010;
  _Bit_type local_4008;
  _Bit_type *local_4000;
  double local_3ff8;
  _Bit_type local_3ff0;
  _Bit_type *local_3fe8;
  _Bit_type local_3fe0;
  _Bit_type *local_3fd8;
  EdgeIdx local_3fd0;
  long local_3fc8;
  result_type local_3fc0;
  EdgeIdx local_3fb8;
  long local_3fb0;
  result_type local_3fa8;
  _Bit_type local_3fa0;
  _Bit_type *local_3f98;
  _Bit_type local_3f90;
  _Bit_type *local_3f88;
  _Bit_type local_3f80;
  _Bit_type *local_3f78;
  EdgeIdx local_3f70;
  long local_3f68;
  result_type local_3f60;
  EdgeIdx local_3f58;
  long *local_3f50;
  CGraph *local_3f48;
  VertexIdx local_3f40;
  EdgeIdx local_3f38;
  size_type local_3f30;
  allocator_type *local_3f28;
  size_type local_3f20;
  allocator_type *local_3f18;
  Parameters *local_3f10;
  Estimates *local_3f08;
  Estimates *local_3f00;
  size_t *local_3ef8;
  result_type_conflict1 local_3ef0;
  bool local_3ee9;
  _Bit_type *local_3ee8;
  uint local_3ee0;
  _Bit_type *local_3ed8;
  uint local_3ed0;
  _Bit_type *local_3ec8;
  uint local_3ec0;
  _Bit_type *local_3eb8;
  uint local_3eb0;
  difference_type local_3ea8;
  VertexIdx vertices_seen;
  _Bit_type *local_3e98;
  uint local_3e90;
  _Bit_type *local_3e88;
  uint local_3e80;
  _Bit_type *local_3e78;
  uint local_3e70;
  _Bit_type *local_3e68;
  uint local_3e60;
  difference_type local_3e58;
  VertexIdx edges_seen;
  double triangleEstimate;
  OrderedEdgeCollection local_3da0;
  undefined1 local_3d28 [8];
  Estimates edge_count_output;
  OrderedEdgeCollection randomEdgeCollection;
  double dStack_3c88;
  int skip;
  double edge_estimate;
  _Bit_type local_3c78;
  double local_3c70;
  double denom_1;
  double denom;
  EdgeIdx e;
  _Bit_type local_3c50;
  _Bit_reference local_3c48;
  value_type local_3c38;
  undefined1 local_3c18 [8];
  uniform_int_distribution<long> dist_parent_nbor;
  EdgeIdx wL;
  _Bit_type local_3bf8;
  _Bit_reference local_3bf0;
  _Bit_reference local_3be0;
  value_type local_3bd0;
  undefined1 local_3bb0 [8];
  uniform_int_distribution<long> dist_parent;
  size_type local_2818;
  EdgeIdx random_nbor_edge;
  VertexIdx deg_of_v3;
  VertexIdx deg_of_v2;
  VertexIdx deg_of_v1;
  VertexIdx v3;
  VertexIdx v2;
  VertexIdx v1;
  double X;
  VertexIdx no_of_query;
  undefined1 local_27c8 [8];
  vector<bool,_std::allocator<bool>_> visited_edge_set;
  undefined1 local_2798 [8];
  vector<bool,_std::allocator<bool>_> visited_vertex_set;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> edge_list;
  undefined1 local_2748 [8];
  mt19937 mt;
  random_device rd;
  VertexIdx seed;
  EdgeIdx walk_length;
  EdgeIdx m;
  VertexIdx n;
  Parameters *params_local;
  CGraph *cg_local;
  
  bVar8 = 0;
  sVar1 = cg->nVertices;
  sVar2 = cg->nEdges;
  dVar3 = (double)params->walk_length;
  local_3f10 = params;
  local_3f08 = __return_storage_ptr__;
  local_3f00 = __return_storage_ptr__;
  pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](&params->seed_vertices,0);
  v2 = *pvVar4;
  local_3ef8 = &mt._M_p;
  std::random_device::random_device((random_device *)local_3ef8);
  local_3ef0 = std::random_device::operator()((random_device *)local_3ef8);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2748,(ulong)local_3ef0);
  std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
            ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
             &visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  local_3f18 = (allocator_type *)
               ((long)&visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage + 6);
  local_3f20 = sVar1;
  std::allocator<bool>::allocator(local_3f18);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_2798,local_3f20,
             (bool *)((long)&visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage + 7),local_3f18);
  std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 6));
  no_of_query._7_1_ = 0;
  local_3f28 = (allocator_type *)((long)&no_of_query + 6);
  local_3f30 = sVar2;
  std::allocator<bool>::allocator(local_3f28);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_27c8,local_3f30,
             (bool *)((long)&no_of_query + 7),local_3f28);
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&no_of_query + 6));
  v1 = 0;
  local_3f38 = Escape::CGraph::degree(cg,v2);
  if (local_3f38 == 0) {
    local_3f50 = &dist_parent._M_param._M_b;
    local_3f48 = cg;
    memcpy(local_3f50,local_2748,5000);
    plVar6 = local_3f50;
    plVar7 = alStack_53c8;
    for (lVar5 = 0x271; lVar5 != 0; lVar5 = lVar5 + -1) {
      *plVar7 = *plVar6;
      plVar6 = plVar6 + (ulong)bVar8 * -2 + 1;
      plVar7 = plVar7 + (ulong)bVar8 * -2 + 1;
    }
    local_3f40 = AlternateSeed(local_3f48);
    v2 = local_3f40;
  }
  deg_of_v2 = Escape::CGraph::degree(cg,v2);
  local_3f58 = deg_of_v2;
  std::uniform_int_distribution<long>::uniform_int_distribution
            ((uniform_int_distribution<long> *)local_3bb0,0,deg_of_v2 + -1);
  X = 4.94065645841247e-324;
  local_3f68 = cg->offsets[v2];
  local_3f60 = std::uniform_int_distribution<long>::operator()
                         ((uniform_int_distribution<long> *)local_3bb0,
                          (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                           *)local_2748);
  __n = local_3f68 + local_3f60;
  v3 = cg->nbors[__n];
  deg_of_v3 = Escape::CGraph::degree(cg,v3);
  local_3bd0.u = v2;
  local_3f70 = deg_of_v3;
  local_3bd0.v = v3;
  local_3bd0.index = __n;
  local_3bd0.degree = deg_of_v2;
  std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::push_back
            ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
             &visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage,&local_3bd0);
  rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                     ((vector<bool,_std::allocator<bool>_> *)local_2798,v2);
  local_3f80 = rVar10._M_mask;
  local_3f78 = rVar10._M_p;
  local_3be0._M_p = local_3f78;
  local_3be0._M_mask = local_3f80;
  std::_Bit_reference::operator=(&local_3be0,true);
  rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                     ((vector<bool,_std::allocator<bool>_> *)local_2798,v3);
  local_3f90 = rVar10._M_mask;
  local_3f88 = rVar10._M_p;
  local_3bf0._M_p = local_3f88;
  local_3bf0._M_mask = local_3f90;
  std::_Bit_reference::operator=(&local_3bf0,true);
  rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                     ((vector<bool,_std::allocator<bool>_> *)local_27c8,__n);
  local_3fa0 = rVar10._M_mask;
  local_3f98 = rVar10._M_p;
  wL = (EdgeIdx)local_3f98;
  local_3bf8 = local_3fa0;
  std::_Bit_reference::operator=((_Bit_reference *)&wL,true);
  for (dist_parent_nbor._M_param._M_b = 0; dist_parent_nbor._M_param._M_b < (long)dVar3;
      dist_parent_nbor._M_param._M_b = dist_parent_nbor._M_param._M_b + 1) {
    std::uniform_int_distribution<long>::uniform_int_distribution
              ((uniform_int_distribution<long> *)local_3c18,0,deg_of_v3 + -1);
    local_3fb0 = cg->offsets[v3];
    local_3fa8 = std::uniform_int_distribution<long>::operator()
                           ((uniform_int_distribution<long> *)local_3c18,
                            (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_2748);
    local_2818 = local_3fb0 + local_3fa8;
    X = (double)((long)X + 1);
    deg_of_v1 = cg->nbors[local_2818];
    local_3fb8 = Escape::CGraph::degree(cg,deg_of_v1);
    random_nbor_edge = local_3fb8;
    if (((local_3f10->NB & 1U) != 0) && (deg_of_v3 != 1)) {
      while (v2 == deg_of_v1) {
        local_3fc8 = cg->offsets[v3];
        local_3fc0 = std::uniform_int_distribution<long>::operator()
                               ((uniform_int_distribution<long> *)local_3c18,
                                (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                 *)local_2748);
        local_2818 = local_3fc8 + local_3fc0;
        X = (double)((long)X + 1);
        deg_of_v1 = cg->nbors[local_2818];
        local_3fd0 = Escape::CGraph::degree(cg,deg_of_v1);
        random_nbor_edge = local_3fd0;
      }
    }
    local_3c38.u = v3;
    local_3c38.v = deg_of_v1;
    local_3c38.index = local_2818;
    local_3c38.degree = deg_of_v3;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::push_back
              ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
               &visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage,&local_3c38);
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_2798,deg_of_v1);
    local_3fe0 = rVar10._M_mask;
    local_3fd8 = rVar10._M_p;
    local_3c48._M_p = local_3fd8;
    local_3c48._M_mask = local_3fe0;
    std::_Bit_reference::operator=(&local_3c48,true);
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_27c8,local_2818);
    local_3ff0 = rVar10._M_mask;
    local_3fe8 = rVar10._M_p;
    e = (EdgeIdx)local_3fe8;
    local_3c50 = local_3ff0;
    std::_Bit_reference::operator=((_Bit_reference *)&e,true);
    local_3ff8 = (double)Escape::CGraph::getEdgeBinary(cg,v2,deg_of_v1);
    X = (double)((long)X + 1);
    if ((((local_3ff8 != -NAN) && (v2 != v3)) && (v3 != deg_of_v1)) && (v2 != deg_of_v1)) {
      if (((local_3f10->CSS & 1U) == 0) || ((local_3f10->NB & 1U) == 0)) {
        if ((local_3f10->CSS & 1U) == 0) {
          lVar5 = deg_of_v3;
          if ((local_3f10->NB & 1U) != 0) {
            lVar5 = deg_of_v3 + -1;
          }
          dVar9 = (double)lVar5;
        }
        else {
          local_3c70 = 1.0 / (double)deg_of_v2 + 1.0 / (double)deg_of_v3 +
                       1.0 / (double)random_nbor_edge;
          dVar9 = 1.0 / local_3c70;
        }
      }
      else {
        denom_1 = 1.0 / (double)(deg_of_v2 + -1) + 1.0 / (double)(deg_of_v3 + -1) +
                  1.0 / (double)(random_nbor_edge + -1);
        dVar9 = 1.0 / denom_1;
      }
      v1 = (VertexIdx)(dVar9 + (double)v1);
    }
    denom = local_3ff8;
    if (local_3ff8 != -NAN) {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_27c8,(size_type)local_3ff8);
      local_4008 = rVar10._M_mask;
      local_4000 = rVar10._M_p;
      edge_estimate = (double)local_4000;
      local_3c78 = local_4008;
      std::_Bit_reference::operator=((_Bit_reference *)&edge_estimate,true);
    }
    v2 = v3;
    deg_of_v2 = deg_of_v3;
    v3 = deg_of_v1;
    deg_of_v3 = random_nbor_edge;
  }
  if ((local_3f10->normalization_count_available & 1U) == 0) {
    randomEdgeCollection.no_of_query._4_4_ = 0x19;
    local_4010 = &randomEdgeCollection;
    edge_count_output.query_complexity = dVar3;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
              ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)local_4010,
               (vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
               &visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage);
    local_4018 = &randomEdgeCollection.edge_list.
                  super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_4018,
               (vector<bool,_std::allocator<bool>_> *)local_27c8);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)
               &randomEdgeCollection.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
                _M_impl.super__Bvector_impl_data._M_end_of_storage,
               (vector<bool,_std::allocator<bool>_> *)local_2798);
    randomEdgeCollection.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_4020 = cg;
    OrderedEdgeCollection::OrderedEdgeCollection
              (&local_3da0,(OrderedEdgeCollection *)&edge_count_output.query_complexity);
    Parameters::Parameters((Parameters *)&triangleEstimate,local_3f10);
    EstimateEdgeCount((Estimates *)local_3d28,local_4020,&local_3da0,(Parameters *)&triangleEstimate
                      ,randomEdgeCollection.no_of_query._4_4_);
    Parameters::~Parameters((Parameters *)&triangleEstimate);
    OrderedEdgeCollection::~OrderedEdgeCollection(&local_3da0);
    dStack_3c88 = (double)local_3d28;
    OrderedEdgeCollection::~OrderedEdgeCollection
              ((OrderedEdgeCollection *)&edge_count_output.query_complexity);
  }
  else {
    dStack_3c88 = (double)cg->nEdges * 1.0;
  }
  if ((local_3f10->CSS & 1U) == 0) {
    edges_seen = (VertexIdx)
                 ((1.0 / (double)(long)dVar3) * (double)v1 * (dStack_3c88 / 2.0) *
                 0.3333333333333333);
  }
  else {
    edges_seen = (VertexIdx)((1.0 / (double)(long)dVar3) * (double)v1 * (dStack_3c88 / 2.0));
  }
  local_3f08->estimate = 0.0;
  local_3f08->fraction_of_vertices_seen = 1.0;
  local_3f08->fraction_of_edges_seen = 1.0;
  local_3f08->query_complexity = 1.0;
  local_3f08->estimate = (double)edges_seen;
  local_4030 = (vector<bool,_std::allocator<bool>_> *)local_27c8;
  iVar11 = std::vector<bool,_std::allocator<bool>_>::begin(local_4030);
  local_3e78 = iVar11.super__Bit_iterator_base._M_p;
  local_3e70 = iVar11.super__Bit_iterator_base._M_offset;
  local_3e68 = local_3e78;
  local_3e60 = local_3e70;
  iVar11 = std::vector<bool,_std::allocator<bool>_>::end(local_4030);
  local_3e98 = iVar11.super__Bit_iterator_base._M_p;
  local_3e90 = iVar11.super__Bit_iterator_base._M_offset;
  vertices_seen._7_1_ = 1;
  __first.super__Bit_iterator_base._M_offset = local_3e60;
  __first.super__Bit_iterator_base._M_p = local_3e68;
  __first.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar11.super__Bit_iterator_base._0_12_,0);
  __last.super__Bit_iterator_base._M_offset = SUB124(iVar11.super__Bit_iterator_base._0_12_,8);
  local_3e88 = local_3e98;
  local_3e80 = local_3e90;
  local_4028 = std::count<std::_Bit_iterator,bool>
                         (__first,__last,(bool *)((long)&vertices_seen + 7));
  local_4040 = (vector<bool,_std::allocator<bool>_> *)local_2798;
  local_3e58 = local_4028;
  iVar11 = std::vector<bool,_std::allocator<bool>_>::begin(local_4040);
  local_3ec8 = iVar11.super__Bit_iterator_base._M_p;
  local_3ec0 = iVar11.super__Bit_iterator_base._M_offset;
  local_3eb8 = local_3ec8;
  local_3eb0 = local_3ec0;
  iVar11 = std::vector<bool,_std::allocator<bool>_>::end(local_4040);
  local_3ee8 = iVar11.super__Bit_iterator_base._M_p;
  local_3ee0 = iVar11.super__Bit_iterator_base._M_offset;
  local_3ee9 = true;
  __first_00.super__Bit_iterator_base._M_offset = local_3eb0;
  __first_00.super__Bit_iterator_base._M_p = local_3eb8;
  __first_00.super__Bit_iterator_base._12_4_ = 0;
  __last_00.super__Bit_iterator_base._12_4_ = 0;
  __last_00.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar11.super__Bit_iterator_base._0_12_,0);
  __last_00.super__Bit_iterator_base._M_offset = SUB124(iVar11.super__Bit_iterator_base._0_12_,8);
  local_3ed8 = local_3ee8;
  local_3ed0 = local_3ee0;
  local_4038 = std::count<std::_Bit_iterator,bool>(__first_00,__last_00,&local_3ee9);
  local_3f08->fraction_of_vertices_seen = ((double)local_4038 * 100.0) / (double)(long)sVar1;
  local_3f08->fraction_of_edges_seen = ((double)local_3e58 * 100.0) / (double)(long)sVar2;
  local_3f08->query_complexity = ((double)(long)X * 100.0) / (double)(long)sVar2;
  local_3ea8 = local_4038;
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)local_27c8);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)local_2798);
  std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::~vector
            ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
             &visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  std::random_device::~random_device((random_device *)&mt._M_p);
  return local_3f00;
}

Assistant:

Estimates SRW1(CGraph *cg, Parameters params)
{
    /**
     * Setting of various input parameters for executing the algorithm
     */
    VertexIdx n = cg->nVertices;
    EdgeIdx m = cg->nEdges; // Note that m is double of the number of edges in the graph
    // VertexIdx seed_count = params.seed_count;  // Unused for now. Reserved for future use
    EdgeIdx walk_length = params.walk_length;
    VertexIdx seed = params.seed_vertices[0]; // We are working with only one seed vertex for this project

    /**
    * Set up random number generator
    * Using this random number generator initializize a PRNG: this PRNG is passed along to
    * draw an element from various distributions
    */
    std::random_device rd;
    std::mt19937 mt(rd());

    /**
     * Data structures for book-keeping and local variables.
     * We do not really need the OrderedEdge vector for SRW.
     * However, if m is not available, and needs to be estimated based on the random walk,
     * then we need the collection of edges.
     */
    std::vector<OrderedEdge> edge_list;
    std::vector <bool > visited_vertex_set(n,false);
    std::vector <bool > visited_edge_set(m,false);
    VertexIdx no_of_query = 0;  // Counts the number of query made by the algorithm
    double X = 0; // This variable keeps a running count of the estimator
    VertexIdx v1, v2, v3, deg_of_v1, deg_of_v2, deg_of_v3;
    EdgeIdx random_nbor_edge;

    /**
     * Algorithm Initialization: Take two steps of the random walk and collect v1 and v2.
     */

    v1 = seed;
    deg_of_v1 = cg->degree(v1); // degree of parent vertex
    if (deg_of_v1 == 0)  // If we are stuck with an isolate vertex, we change the seed
        v1 = AlternateSeed(cg,mt);
    deg_of_v1 = cg->degree(v1);
    std::uniform_int_distribution<VertexIdx> dist_parent(0, deg_of_v1 - 1);
    no_of_query++; // One query to the uniform random neighbor oracle
    random_nbor_edge = cg->offsets[v1] + dist_parent(mt); // TODO: check randomness. same seeding ok?
    v2 = cg->nbors[random_nbor_edge]; // child is the potential next vertex on the random walk
    deg_of_v2 = cg->degree(v2);// degree of the child vertex

    /**
    * Update data structures
    */
    edge_list.push_back(OrderedEdge{v1, v2, random_nbor_edge, deg_of_v1}); // Note that we do not care of the ordering of the edge.
    visited_vertex_set[v1] = true;
    visited_vertex_set[v2] = true;
    visited_edge_set[random_nbor_edge] = true;


    for (EdgeIdx wL = 0; wL < walk_length; wL++) {  // Perform a random walk of length walk_length from the vertex v2
        std::uniform_int_distribution<VertexIdx> dist_parent_nbor(0, deg_of_v2 - 1); // v2 is the current last visited vertex on the random walk
        random_nbor_edge = cg->offsets[v2] + dist_parent_nbor(mt); // TODO: check randomness. same seeding ok?
        no_of_query++; // One query to the uniform random neighbor oracle
        v3 = cg->nbors[random_nbor_edge]; // v3 is the  new vertex on the random walk
        deg_of_v3 = cg->degree(v3);// degree of the vertex v3

        /**
         * The parameter NB decides if the random walk is non-backtracking.
         * If it is true, then v1-v2-v1 becomes an invalid state.
         * We sample another random neighbor in that case.
         * Also, in final estimation, d'(u)=d(u)-1 is used.
         */
        if (params.NB and deg_of_v2!= 1) { // if v_2 is singleton, then only one option
            while (v1 == v3) { // We reached an invalid state, resample.
                random_nbor_edge = cg->offsets[v2] + dist_parent_nbor(mt); // TODO: check randomness. same seeding ok?
                no_of_query++; // One query to the uniform random neighbor oracle
                v3 = cg->nbors[random_nbor_edge]; // v3 is the  new vertex on the random walk
                deg_of_v3 = cg->degree(v3);// degree of the vertex v3
            }
        }

        /**
         * Update data structures
         */
        edge_list.push_back(OrderedEdge{v2, v3, random_nbor_edge, deg_of_v2}); // Note that we do not care of the ordering of the edge.
        visited_vertex_set[v3] = true;
        visited_edge_set[random_nbor_edge] = true;

        /**
         * Check if v1, v2 and v3 forms a triangle
         * Note that (v1,v2) and (v2,v3) edges are present.
         * So we check if (v1,v3) edge is present and if all v1,v2 and v3 are distinct
         */
        EdgeIdx e = cg->getEdgeBinary(v1,v3);
        no_of_query++; // One query to the edge query oracle
        if (e!= -1 && v1!=v2 && v2!=v3 && v1!=v3) {
            if (params.CSS && params.NB) {  // Both CSS and NB are true
                double denom = (1.0 / (deg_of_v1-1)) +
                                (1.0 /(deg_of_v2-1)) +
                                (1.0 /(deg_of_v3-1));
                X += 1.0 / denom;
            }
            else if (params.CSS){ // Only CSS is true
                double denom = (1.0 / deg_of_v1) + (1.0 /deg_of_v2) + (1.0 /deg_of_v3);
                X += 1.0 / denom;
            }
            else if (params.NB) // Only NB is true
                X+= deg_of_v2 - 1;
            else                // Both CSS and NB are false
                X += deg_of_v2;


        }

        /**
         * Update data structures
         */
        if (e!= -1)
            visited_edge_set[e] =true;
        /**
         * slide the window of history!
         */
        v1 = v2;
        deg_of_v1 = deg_of_v2;
        v2 = v3;
        deg_of_v2 = deg_of_v3;
    }

    double edge_estimate = 0.0;
    /**
     * Depending on whether the total number of edges in the graphs is available or not, compute it.
     */
    if (!params.normalization_count_available) {
        int skip = 25;
        OrderedEdgeCollection randomEdgeCollection = {walk_length, edge_list, visited_edge_set, visited_vertex_set};
        Estimates edge_count_output = EstimateEdgeCount(cg, randomEdgeCollection, params, skip);
        edge_estimate = edge_count_output.estimate;
    }
    else
        edge_estimate = cg->nEdges *1.0;

    /**
     * Estimate the number of triangles.
     */
    double triangleEstimate = 0.0;
    if (params.CSS)
        triangleEstimate = (1.0/walk_length) * X * (edge_estimate / 2.0) ; // Note that m is actually twice the number of edges
    else
        triangleEstimate = (1.0/walk_length) * X * (edge_estimate/2.0) * (1/ 3.0) ; // Note that m is actually twice the number of edges

    /**
     * Populate the return structure
     */
    Estimates return_estimate = {};
    return_estimate.estimate = triangleEstimate;

    VertexIdx edges_seen = std::count(visited_edge_set.begin(),visited_edge_set.end(),true);
    VertexIdx vertices_seen = std::count(visited_vertex_set.begin(),visited_vertex_set.end(), true);

    return_estimate.fraction_of_vertices_seen = vertices_seen * 100.0 / n;
    return_estimate.fraction_of_edges_seen = edges_seen * 100.0 / m;
    return_estimate.query_complexity = no_of_query * 100.0 /m;

    return return_estimate;
}